

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O1

vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> * __thiscall
Iir::Biquad::getPoleZeros
          (vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *__return_storage_ptr__,
          Biquad *this)

{
  iterator __position;
  BiquadPoleState bps;
  BiquadPoleState local_58;
  
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BiquadPoleState::BiquadPoleState(&local_58,this);
  __position._M_current =
       (__return_storage_ptr__->
       super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Iir::PoleZeroPair,std::allocator<Iir::PoleZeroPair>>::
    _M_realloc_insert<Iir::PoleZeroPair_const&>
              ((vector<Iir::PoleZeroPair,std::allocator<Iir::PoleZeroPair>> *)__return_storage_ptr__
               ,__position,&local_58.super_PoleZeroPair);
  }
  else {
    *(undefined8 *)((__position._M_current)->zeros).super_complex_pair_t.second._M_value =
         local_58.super_PoleZeroPair.zeros.super_complex_pair_t.second._M_value._0_8_;
    *(undefined8 *)(((__position._M_current)->zeros).super_complex_pair_t.second._M_value + 8) =
         local_58.super_PoleZeroPair.zeros.super_complex_pair_t.second._M_value._8_8_;
    *(undefined8 *)((__position._M_current)->zeros).super_complex_pair_t.first._M_value =
         local_58.super_PoleZeroPair.zeros.super_complex_pair_t.first._M_value._0_8_;
    *(undefined8 *)(((__position._M_current)->zeros).super_complex_pair_t.first._M_value + 8) =
         local_58.super_PoleZeroPair.zeros.super_complex_pair_t.first._M_value._8_8_;
    *(undefined8 *)((__position._M_current)->poles).super_complex_pair_t.second._M_value =
         local_58.super_PoleZeroPair.poles.super_complex_pair_t.second._M_value._0_8_;
    *(undefined8 *)(((__position._M_current)->poles).super_complex_pair_t.second._M_value + 8) =
         local_58.super_PoleZeroPair.poles.super_complex_pair_t.second._M_value._8_8_;
    *(undefined8 *)((__position._M_current)->poles).super_complex_pair_t.first._M_value =
         local_58.super_PoleZeroPair.poles.super_complex_pair_t.first._M_value._0_8_;
    *(undefined8 *)(((__position._M_current)->poles).super_complex_pair_t.first._M_value + 8) =
         local_58.super_PoleZeroPair.poles.super_complex_pair_t.first._M_value._8_8_;
    (__return_storage_ptr__->
    super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>)._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<PoleZeroPair> Biquad::getPoleZeros () const
	{
		std::vector<PoleZeroPair> vpz;
		BiquadPoleState bps (*this);
		vpz.push_back (bps);
		return vpz;
	}